

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompactSingleLevelBreitWigner.test.cpp
# Opt level: O1

string * chunk_abi_cxx11_(void)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)in_RDI,
             " 2.500000+0 7.945990-1          0          2          0          1822832151     \n 0.000000+0 7.945990-2          0          0          0          0822832151     \n 2.032137+2 0.000000+0          0          0         24          2822832151     \n-8.684388+3 1.000000+0 7.761335-1 1.005949-1 6.755386-1 0.000000+0822832151     \n 8.684390-3 0.000000+0 0.000000+0 1.005950-6 6.755390-2 0.000000+0822832151     \n-5.815640+3 2.000000+0 3.788054+0 2.995726+0 7.923275-1 0.000000+0822832151     \n 5.815640-3 0.000000+0 0.000000+0 2.995730-5 7.923280-2 0.000000+0822832151     \n 0.000000+0 0.000000+0          2         87          0          0822832151     \n"
             ,"");
  return in_RDI;
}

Assistant:

std::string chunk() {
  return
    " 2.500000+0 7.945990-1          0          2          0          1822832151     \n"
    " 0.000000+0 7.945990-2          0          0          0          0822832151     \n"
    " 2.032137+2 0.000000+0          0          0         24          2822832151     \n"
    "-8.684388+3 1.000000+0 7.761335-1 1.005949-1 6.755386-1 0.000000+0822832151     \n"
    " 8.684390-3 0.000000+0 0.000000+0 1.005950-6 6.755390-2 0.000000+0822832151     \n"
    "-5.815640+3 2.000000+0 3.788054+0 2.995726+0 7.923275-1 0.000000+0822832151     \n"
    " 5.815640-3 0.000000+0 0.000000+0 2.995730-5 7.923280-2 0.000000+0822832151     \n"
    " 0.000000+0 0.000000+0          2         87          0          0822832151     \n";
}